

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2closest_edge_query_base.h
# Opt level: O2

void __thiscall
S2ClosestEdgeQueryBase<S2MaxDistance>::FindClosestEdges
          (S2ClosestEdgeQueryBase<S2MaxDistance> *this,Target *target,Options *options,
          vector<S2ClosestEdgeQueryBase<S2MaxDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>_>
          *results)

{
  pointer pRVar1;
  btree_set<S2ClosestEdgeQueryBase<S2MaxDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>,_256>
  *this_00;
  iterator iVar2;
  iterator iVar3;
  
  FindClosestEdgesInternal(this,target,options);
  pRVar1 = (results->
           super__Vector_base<S2ClosestEdgeQueryBase<S2MaxDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((results->
      super__Vector_base<S2ClosestEdgeQueryBase<S2MaxDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>_>
      )._M_impl.super__Vector_impl_data._M_finish != pRVar1) {
    (results->
    super__Vector_base<S2ClosestEdgeQueryBase<S2MaxDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>_>
    )._M_impl.super__Vector_impl_data._M_finish = pRVar1;
  }
  if (options->max_results_ == 0x7fffffff) {
    std::
    __sort<__gnu_cxx::__normal_iterator<S2ClosestEdgeQueryBase<S2MaxDistance>::Result*,std::vector<S2ClosestEdgeQueryBase<S2MaxDistance>::Result,std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>>>,__gnu_cxx::__ops::_Iter_less_iter>
              ((this->result_vector_).
               super__Vector_base<S2ClosestEdgeQueryBase<S2MaxDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (this->result_vector_).
               super__Vector_base<S2ClosestEdgeQueryBase<S2MaxDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    std::
    unique_copy<__gnu_cxx::__normal_iterator<S2ClosestEdgeQueryBase<S2MaxDistance>::Result*,std::vector<S2ClosestEdgeQueryBase<S2MaxDistance>::Result,std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>>>,std::back_insert_iterator<std::vector<S2ClosestEdgeQueryBase<S2MaxDistance>::Result,std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>>>>
              ((this->result_vector_).
               super__Vector_base<S2ClosestEdgeQueryBase<S2MaxDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (this->result_vector_).
               super__Vector_base<S2ClosestEdgeQueryBase<S2MaxDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               (back_insert_iterator<std::vector<S2ClosestEdgeQueryBase<S2MaxDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>_>_>
                )results);
    pRVar1 = (this->result_vector_).
             super__Vector_base<S2ClosestEdgeQueryBase<S2MaxDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->result_vector_).
        super__Vector_base<S2ClosestEdgeQueryBase<S2MaxDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>_>
        ._M_impl.super__Vector_impl_data._M_finish != pRVar1) {
      (this->result_vector_).
      super__Vector_base<S2ClosestEdgeQueryBase<S2MaxDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>_>
      ._M_impl.super__Vector_impl_data._M_finish = pRVar1;
    }
  }
  else {
    if (options->max_results_ != 1) {
      this_00 = &this->result_set_;
      iVar2 = gtl::internal_btree::
              btree<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MaxDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>,_256,_false>_>
              ::begin((btree<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MaxDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>,_256,_false>_>
                       *)this_00);
      iVar3 = gtl::internal_btree::
              btree<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MaxDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>,_256,_false>_>
              ::end((btree<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MaxDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>,_256,_false>_>
                     *)this_00);
      std::
      vector<S2ClosestEdgeQueryBase<S2MaxDistance>::Result,std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>>
      ::
      _M_assign_aux<gtl::internal_btree::btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MaxDistance>::Result,std::less<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>,std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>,256,false>>,S2ClosestEdgeQueryBase<S2MaxDistance>::Result&,S2ClosestEdgeQueryBase<S2MaxDistance>::Result*>>
                ((vector<S2ClosestEdgeQueryBase<S2MaxDistance>::Result,std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>>
                  *)results,iVar2.node,iVar2.position,iVar3.node,iVar3.position);
      gtl::internal_btree::
      btree<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MaxDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>,_256,_false>_>
      ::clear((btree<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MaxDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>,_256,_false>_>
               *)this_00);
      return;
    }
    if (-1 < (this->result_singleton_).shape_id_) {
      std::
      vector<S2ClosestEdgeQueryBase<S2MaxDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>_>
      ::push_back(results,&this->result_singleton_);
      return;
    }
  }
  return;
}

Assistant:

void S2ClosestEdgeQueryBase<Distance>::FindClosestEdges(
    Target* target, const Options& options,
    std::vector<Result>* results) {
  FindClosestEdgesInternal(target, options);
  results->clear();
  if (options.max_results() == 1) {
    if (result_singleton_.shape_id() >= 0) {
      results->push_back(result_singleton_);
    }
  } else if (options.max_results() == Options::kMaxMaxResults) {
    std::sort(result_vector_.begin(), result_vector_.end());
    std::unique_copy(result_vector_.begin(), result_vector_.end(),
                     std::back_inserter(*results));
    result_vector_.clear();
  } else {
    results->assign(result_set_.begin(), result_set_.end());
    result_set_.clear();
  }
}